

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::Write(TPZCompElHDiv<pzshape::TPZShapeLinear> *this)

{
  int in_EDX;
  TPZStream *in_RSI;
  
  Write((TPZCompElHDiv<pzshape::TPZShapeLinear> *)
        ((long)(this->fSideOrient).fExtAlloc +
        *(long *)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                            super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                 + -0x40) + -0x68),in_RSI,in_EDX);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
  buf.Write(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order(3,0);
	this->fIntRule.GetOrder(order);
	buf.Write(order);
    buf.Write(fSideOrient);

	buf.Write(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Write(&this->fPreferredOrder,1);
    buf.Write(fSideOrient);
    int sz = fRestraints.size();
    buf.Write(&sz);
    for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++) {
        it->Write(buf);
    }
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}